

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bpt_helper.c
# Opt level: O1

_Bool check_hw_breakpoints(CPUX86State *env,_Bool force_dr6_update)

{
  _Bool _Var1;
  _Bool _Var2;
  byte bVar3;
  byte bVar4;
  target_ulong tVar5;
  ulong uVar6;
  bool bVar7;
  
  tVar5 = env->dr[6] & 0xfffffffffffffff0;
  bVar3 = 0x10;
  bVar4 = 0;
  uVar6 = 0;
  _Var1 = false;
  _Var2 = false;
  do {
    switch((uint)(env->dr[7] >> (bVar3 & 0x3f)) & 3) {
    case 0:
      bVar7 = env->dr[uVar6] == env->eip;
LAB_0050a88c:
      if (bVar7) {
        tVar5 = tVar5 | 1L << (uVar6 & 0x3f);
        _Var2 = _Var1;
        if ((env->dr[7] & (1L << (bVar4 & 0x3f) | 2L << (bVar4 & 0x3f))) != 0) {
          _Var1 = true;
          _Var2 = true;
        }
      }
      break;
    default:
      if (env->dr[uVar6 + 8] != 0) {
        bVar7 = (*(byte *)(env->dr[uVar6 + 8] + 0x1c) & 0xc0) != 0;
        goto LAB_0050a88c;
      }
      break;
    case 2:
      break;
    }
    uVar6 = uVar6 + 1;
    bVar3 = bVar3 + 4;
    bVar4 = bVar4 + 2;
    if (uVar6 == 4) {
      if (force_dr6_update || _Var2 != false) {
        env->dr[6] = tVar5;
      }
      return _Var2;
    }
  } while( true );
}

Assistant:

static bool check_hw_breakpoints(CPUX86State *env, bool force_dr6_update)
{
    target_ulong dr6;
    int reg;
    bool hit_enabled = false;

    dr6 = env->dr[6] & ~0xf;
    for (reg = 0; reg < DR7_MAX_BP; reg++) {
        bool bp_match = false;
        bool wp_match = false;

        switch (hw_breakpoint_type(env->dr[7], reg)) {
        case DR7_TYPE_BP_INST:
            if (env->dr[reg] == env->eip) {
                bp_match = true;
            }
            break;
        case DR7_TYPE_DATA_WR:
        case DR7_TYPE_DATA_RW:
            if (env->cpu_watchpoint[reg] &&
                env->cpu_watchpoint[reg]->flags & BP_WATCHPOINT_HIT) {
                wp_match = true;
            }
            break;
        case DR7_TYPE_IO_RW:
            break;
        }
        if (bp_match || wp_match) {
            dr6 |= 1ULL << reg;
            if (hw_breakpoint_enabled(env->dr[7], reg)) {
                hit_enabled = true;
            }
        }
    }

    if (hit_enabled || force_dr6_update) {
        env->dr[6] = dr6;
    }

    return hit_enabled;
}